

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_attrsize(unsigned_long flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  unsigned_long flags_local;
  
  iVar1 = 0;
  if ((flags & 1) != 0) {
    iVar1 = 8;
  }
  iVar2 = 0;
  if ((flags & 2) != 0) {
    iVar2 = 8;
  }
  iVar3 = 0;
  if ((flags & 4) != 0) {
    iVar3 = 4;
  }
  iVar4 = 0;
  if ((flags & 8) != 0) {
    iVar4 = 8;
  }
  return iVar1 + 4 + iVar2 + iVar3 + iVar4;
}

Assistant:

static int sftp_attrsize(unsigned long flags)
{
    return 4 +                                 /* flags(4) */
           ((flags & LIBSSH2_SFTP_ATTR_SIZE) ? 8 : 0) +
           ((flags & LIBSSH2_SFTP_ATTR_UIDGID) ? 8 : 0) +
           ((flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) ? 4 : 0) +
           ((flags & LIBSSH2_SFTP_ATTR_ACMODTIME) ? 8 : 0);
    /* atime + mtime as u32 */
}